

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

void Abc_InfoRandomBytes(uint *p,int nWords)

{
  uint uVar1;
  uint uVar2;
  int local_18;
  int Num;
  int i;
  int nWords_local;
  uint *p_local;
  
  for (local_18 = nWords + -1; -1 < local_18; local_18 = local_18 + -1) {
    uVar1 = rand();
    uVar2 = 0;
    if ((uVar1 & 1) != 0) {
      uVar2 = 0xff;
    }
    p[local_18] = uVar2;
    uVar2 = 0;
    if ((uVar1 & 2) != 0) {
      uVar2 = 0xff;
    }
    p[local_18] = p[local_18] << 8 | uVar2;
    uVar2 = 0;
    if ((uVar1 & 4) != 0) {
      uVar2 = 0xff;
    }
    p[local_18] = p[local_18] << 8 | uVar2;
    uVar2 = 0;
    if ((uVar1 & 8) != 0) {
      uVar2 = 0xff;
    }
    p[local_18] = p[local_18] << 8 | uVar2;
  }
  return;
}

Assistant:

void Abc_InfoRandomBytes( unsigned * p, int nWords ) 
{ 
    int i, Num; 
    for ( i = nWords - 1; i >= 0; i-- ) 
    { 
        Num = rand(); 
        p[i] = (Num & 1)? 0xff : 0;
        p[i] = (p[i] << 8) | ((Num & 2)? 0xff : 0);
        p[i] = (p[i] << 8) | ((Num & 4)? 0xff : 0);
        p[i] = (p[i] << 8) | ((Num & 8)? 0xff : 0);
    } 
//    Extra_PrintBinary( stdout, p, 32 ); printf( "\n" );
}